

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_setConnectionIdForConnection_Test::TestBody
          (Connection_setConnectionIdForConnection_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  AssertHelper local_398 [8];
  Message local_390 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_4;
  string local_350 [32];
  AssertHelper local_330 [8];
  Message local_328 [8];
  shared_ptr<libcellml::Variable> local_320;
  shared_ptr<libcellml::Variable> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_3;
  string local_2c8 [32];
  shared_ptr<libcellml::Variable> local_2a8;
  shared_ptr<libcellml::Variable> local_298;
  AssertHelper local_288 [8];
  Message local_280 [8];
  shared_ptr<libcellml::Variable> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_2;
  string local_230 [32];
  shared_ptr<libcellml::Variable> local_210;
  AssertHelper local_200 [8];
  Message local_1f8 [8];
  shared_ptr<libcellml::Variable> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  string local_1a8 [32];
  shared_ptr<libcellml::Variable> local_188;
  AssertHelper local_178 [8];
  Message local_170 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  AssertionResult gtest_ar;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr comp2;
  ComponentPtr comp1;
  ModelPtr m;
  Connection_setConnectionIdForConnection_Test *this_local;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp2.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"component1",&local_81);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b8,"component2",&local_b9);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"variable1",&local_e1);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  peVar3 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"variable2",&local_109);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&comp2.
                            super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar2 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
  libcellml::Component::addVariable((shared_ptr *)peVar2);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  peVar4 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
  libcellml::ComponentEntity::addComponent((shared_ptr *)peVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_130,"mappingId",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_60,local_130);
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_168,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_148,"\"\"",
             "libcellml::Variable::equivalenceConnectionId(v1, v2)",(char (*) [1])0x12603e,
             &local_168);
  std::__cxx11::string::~string((string *)&local_168);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x297,pcVar5);
    testing::internal::AssertHelper::operator=(local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(local_178);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_188,(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a8,"mappingId",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)&local_188,local_1a8);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_188);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_1f0,(nullptr_t)0x0);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_1e0,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"\"\"",
             "libcellml::Variable::equivalenceConnectionId(v1, nullptr)",(char (*) [1])0x12603e,
             &local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x299,pcVar5);
    testing::internal::AssertHelper::operator=(local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(local_200);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_210,(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,"mappingId",(allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&local_210,(shared_ptr *)local_60,local_230);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_210);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_278,(nullptr_t)0x0);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_268,(shared_ptr *)&local_278);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_248,"\"\"",
             "libcellml::Variable::equivalenceConnectionId(nullptr, v2)",(char (*) [1])0x12603e,
             &local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_278);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(local_280);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              (local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x29b,pcVar5);
    testing::internal::AssertHelper::operator=(local_288,local_280);
    testing::internal::AssertHelper::~AssertHelper(local_288);
    testing::Message::~Message(local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_298,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_2a8,(nullptr_t)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2c8,"mappingId",(allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceConnectionId
            ((shared_ptr *)&local_298,(shared_ptr *)&local_2a8,local_2c8);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_3.message_.ptr_ + 7));
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_2a8);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_298);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_310,(nullptr_t)0x0);
  std::shared_ptr<libcellml::Variable>::shared_ptr(&local_320,(nullptr_t)0x0);
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_300,(shared_ptr *)&local_310);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_2e0,"\"\"",
             "libcellml::Variable::equivalenceConnectionId(nullptr, nullptr)",(char (*) [1])0x12603e
             ,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_320);
  std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar1) {
    testing::Message::Message(local_328);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              (local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x29d,pcVar5);
    testing::internal::AssertHelper::operator=(local_330,local_328);
    testing::internal::AssertHelper::~AssertHelper(local_330);
    testing::Message::~Message(local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  libcellml::Variable::addEquivalence
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_350,"mappingId",(allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  libcellml::Variable::setEquivalenceMappingId
            ((shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (shared_ptr *)local_60,local_350);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_4.message_.ptr_ + 7));
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_388,
             (shared_ptr *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::internal::EqHelper<false>::Compare<char[10],std::__cxx11::string>
            ((EqHelper<false> *)local_368,"\"mappingId\"",
             "libcellml::Variable::equivalenceMappingId(v1, v2)",(char (*) [10])"mappingId",
             &local_388);
  std::__cxx11::string::~string((string *)&local_388);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar1) {
    testing::Message::Message(local_390);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              (local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/connection/connection.cpp"
               ,0x2a2,pcVar5);
    testing::internal::AssertHelper::operator=(local_398,local_390);
    testing::internal::AssertHelper::~AssertHelper(local_398);
    testing::Message::~Message(local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_60);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)
             &v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<libcellml::Component>::~shared_ptr
            ((shared_ptr<libcellml::Component> *)
             &comp2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)
             &comp1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

TEST(Connection, setConnectionIdForConnection)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    comp1->setName("component1");
    comp2->setName("component2");
    v1->setName("variable1");
    v2->setName("variable2");

    comp1->addVariable(v1);
    comp2->addVariable(v2);
    m->addComponent(comp1);
    m->addComponent(comp2);

    libcellml::Variable::setEquivalenceConnectionId(v1, v2, "mappingId");
    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(v1, v2));
    libcellml::Variable::setEquivalenceConnectionId(v1, nullptr, "mappingId");
    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(v1, nullptr));
    libcellml::Variable::setEquivalenceConnectionId(nullptr, v2, "mappingId");
    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(nullptr, v2));
    libcellml::Variable::setEquivalenceConnectionId(nullptr, nullptr, "mappingId");
    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(nullptr, nullptr));

    libcellml::Variable::addEquivalence(v1, v2);

    libcellml::Variable::setEquivalenceMappingId(v1, v2, "mappingId");
    EXPECT_EQ("mappingId", libcellml::Variable::equivalenceMappingId(v1, v2));
}